

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O0

int __thiscall
FCELTexture::CopyTrueColorPixels
          (FCELTexture *this,FBitmap *bitmap,int x,int y,int rotate,FCopyInfo *info)

{
  long lVar1;
  PalEntry *local_778;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_76c;
  BYTE *local_768;
  BYTE *color;
  size_t i;
  PalEntry palette [256];
  BYTE *local_350;
  BYTE *pixels;
  CELPalette celPalette;
  FCopyInfo *info_local;
  int rotate_local;
  int y_local;
  int x_local;
  FBitmap *bitmap_local;
  FCELTexture *this_local;
  
  memset(&pixels,0,0x300);
  local_350 = (BYTE *)0x0;
  anon_unknown.dwarf_6cd17b::LoadCELLump
            ((this->super_FTexture).SourceLump,(CELPalette *)&pixels,&local_350);
  local_778 = (PalEntry *)&i;
  do {
    PalEntry::PalEntry(local_778);
    local_778 = local_778 + 1;
  } while (local_778 != palette + 0xfe);
  for (color = (BYTE *)0x0; color < (BYTE *)0x100; color = color + 1) {
    lVar1 = (long)color * 3;
    local_768 = celPalette + lVar1 + -8;
    PalEntry::PalEntry((PalEntry *)&local_76c.field_0,0xff,*local_768,celPalette[lVar1 + -7],
                       celPalette[lVar1 + -6]);
    palette[(long)(color + -2)].field_0 = local_76c;
  }
  palette[0xfd].field_0.field_0.a = '\0';
  (*bitmap->_vptr_FBitmap[3])
            (bitmap,(ulong)(uint)x,(ulong)(uint)y,local_350,(ulong)(this->super_FTexture).Width,
             (ulong)(this->super_FTexture).Height,1,(uint)(this->super_FTexture).Width,rotate,&i,
             info);
  if (local_350 != (BYTE *)0x0) {
    operator_delete__(local_350);
  }
  return 1;
}

Assistant:

int FCELTexture::CopyTrueColorPixels(FBitmap* bitmap, int x, int y, int rotate, FCopyInfo* info)
{
	CELPalette celPalette = {};
	BYTE* pixels = NULL;

	LoadCELLump(SourceLump, celPalette, pixels);

	PalEntry palette[256];

	for (size_t i = 0; i < 256; ++i)
	{
		const BYTE* const color = &celPalette[3 * i];
		palette[i] = PalEntry(255, color[0], color[1], color[2]);
	}

	// The last palette entry is an alpha mask
	palette[255].a = 0;

	bitmap->CopyPixelData(x, y, pixels, Width, Height, 1, Width, rotate, palette, info);

	delete[] pixels;

	return 1;
}